

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O0

void __thiscall QTemporaryDir::QTemporaryDir(QTemporaryDir *this)

{
  long lVar1;
  Data *pDVar2;
  QTemporaryDirPrivate *in_RDI;
  long in_FS_OFFSET;
  QTemporaryDirPrivate *in_stack_ffffffffffffffa0;
  QString *in_stack_ffffffffffffffd0;
  QTemporaryDirPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pDVar2 = (Data *)operator_new(0x20);
  QTemporaryDirPrivate::QTemporaryDirPrivate(in_stack_ffffffffffffffa0);
  (in_RDI->pathOrError).d.d = pDVar2;
  defaultTemplateName();
  QTemporaryDirPrivate::create(this_00,in_stack_ffffffffffffffd0);
  QString::~QString((QString *)0x2f676a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTemporaryDir::QTemporaryDir()
    : d_ptr(new QTemporaryDirPrivate)
{
    d_ptr->create(defaultTemplateName());
}